

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O2

int __thiscall kj::WaitScope::poll(WaitScope *this,pollfd *__fds,nfds_t __nfds,int __timeout)

{
  bool bVar1;
  int iVar2;
  EventLoop *this_00;
  long in_FS_OFFSET;
  Fault f;
  Fault local_18;
  
  this_00 = this->loop;
  if (this_00 != *(EventLoop **)(in_FS_OFFSET + -0x10)) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[37]>
              (&local_18,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async.c++"
               ,0x196,FAILED,"&loop == threadLocalEventLoop",
               "\"WaitScope not valid for this thread.\"",
               (char (*) [37])"WaitScope not valid for this thread.");
    kj::_::Debug::Fault::fatal(&local_18);
  }
  if (this_00->running != true) {
    this_00->running = true;
    do {
      do {
        bVar1 = EventLoop::turn(this_00);
        this_00 = this->loop;
      } while (bVar1);
      iVar2 = (*this_00->port->_vptr_EventPort[1])();
      this_00 = this->loop;
    } while (this_00->head != (Event *)0x0);
    this_00->running = false;
    return iVar2;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[51]>
            (&local_18,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async.c++"
             ,0x197,FAILED,"!loop.running","\"poll() is not allowed from within event callbacks.\"",
             (char (*) [51])"poll() is not allowed from within event callbacks.");
  kj::_::Debug::Fault::fatal(&local_18);
}

Assistant:

void WaitScope::poll() {
  KJ_REQUIRE(&loop == threadLocalEventLoop, "WaitScope not valid for this thread.");
  KJ_REQUIRE(!loop.running, "poll() is not allowed from within event callbacks.");

  loop.running = true;
  KJ_DEFER(loop.running = false);

  for (;;) {
    if (!loop.turn()) {
      // No events in the queue.  Poll for I/O.
      loop.port.poll();

      if (!loop.isRunnable()) {
        // Still no events in the queue. We're done.
        return;
      }
    }
  }
}